

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testfonts.cpp
# Opt level: O3

void update_font_numbers(Am_Drawonable *font_win,bool print_numbers)

{
  undefined7 in_register_00000031;
  
  (**(code **)(*(long *)font_win + 0xd0))
            (font_win,&test_font,test_string,test_str_len,&test_string_width,&test_string_ascent,
             &test_string_descent,&test_string_left_bearing,&test_string_right_bearing);
  test_string_height = test_string_descent + test_string_ascent;
  if ((int)CONCAT71(in_register_00000031,print_numbers) != 0) {
    printf("test_string_width = %d,  test_string_ascent = %d,  test_string_descent = %d\n",
           (ulong)(uint)test_string_width);
    printf("left_bearing = %d,  right_bearing = %d\n",(ulong)(uint)test_string_left_bearing,
           (ulong)(uint)test_string_right_bearing);
    return;
  }
  return;
}

Assistant:

void
update_font_numbers(Am_Drawonable *font_win, bool print_numbers = false)
{
  font_win->Get_String_Extents(test_font, test_string, test_str_len,
                               test_string_width, test_string_ascent,
                               test_string_descent, test_string_left_bearing,
                               test_string_right_bearing);
  test_string_height = test_string_ascent + test_string_descent;
  if (print_numbers) {
    printf("test_string_width = %d,  test_string_ascent = %d,  "
           "test_string_descent = %d\n",
           test_string_width, test_string_ascent, test_string_descent);
    printf("left_bearing = %d,  right_bearing = %d\n", test_string_left_bearing,
           test_string_right_bearing);
  }
}